

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O0

void __thiscall Assimp::ObjFile::Model::~Model(Model *this)

{
  Object *this_00;
  Mesh *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  Material *this_03;
  bool bVar1;
  reference ppOVar2;
  reference ppMVar3;
  pointer ppVar4;
  pointer ppVar5;
  _Self local_50;
  _Self local_48;
  iterator it_3;
  _Self local_38;
  GroupMapIt it_2;
  __normal_iterator<Assimp::ObjFile::Mesh_**,_std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>_>
  local_28;
  iterator it_1;
  __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
  local_18;
  iterator it;
  Model *this_local;
  
  it._M_current = (Object **)this;
  local_18._M_current =
       (Object **)
       std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::begin
                 (&this->m_Objects);
  while( true ) {
    it_1._M_current =
         (Mesh **)std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                  ::end(&this->m_Objects);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
                        *)&it_1);
    if (!bVar1) break;
    ppOVar2 = __gnu_cxx::
              __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppOVar2;
    if (this_00 != (Object *)0x0) {
      ObjFile::Object::~Object(this_00);
      operator_delete(this_00,0x90);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ObjFile::Object_**,_std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::clear
            (&this->m_Objects);
  local_28._M_current =
       (Mesh **)std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::
                begin(&this->m_Meshes);
  while( true ) {
    it_2._M_node = (_Base_ptr)
                   std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::
                   end(&this->m_Meshes);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Assimp::ObjFile::Mesh_**,_std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>_>
                        *)&it_2);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<Assimp::ObjFile::Mesh_**,_std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>_>
              ::operator*(&local_28);
    this_01 = *ppMVar3;
    if (this_01 != (Mesh *)0x0) {
      ObjFile::Mesh::~Mesh(this_01);
      operator_delete(this_01,0x70);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ObjFile::Mesh_**,_std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>_>
    ::operator++(&local_28);
  }
  std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::clear
            (&this->m_Meshes);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
       ::begin(&this->m_Groups);
  while( true ) {
    it_3._M_node = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                   ::end(&this->m_Groups);
    bVar1 = std::operator!=(&local_38,(_Self *)&it_3);
    if (!bVar1) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
             ::operator->(&local_38);
    this_02 = ppVar4->second;
    if (this_02 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_02);
      operator_delete(this_02,0x18);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
    ::operator++(&local_38);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::clear(&this->m_Groups);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
       ::begin(&this->m_MaterialMap);
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
         ::end(&this->m_MaterialMap);
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
             ::operator->(&local_48);
    this_03 = ppVar5->second;
    if (this_03 != (Material *)0x0) {
      ObjFile::Material::~Material(this_03);
      operator_delete(this_03,0x409c);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>
    ::operator++(&local_48);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ObjFile::Material_*>_>_>
  ::~map(&this->m_MaterialMap);
  std::vector<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>::~vector
            (&this->m_Meshes);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            (&this->m_TextureCoord);
  std::__cxx11::string::~string((string *)&this->m_strActiveGroup);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  ::~map(&this->m_Groups);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            (&this->m_VertexColors);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_Normals);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->m_Vertices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_MaterialLib);
  std::vector<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>::~vector
            (&this->m_Objects);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Model() {
        // Clear all stored object instances
        for (std::vector<Object*>::iterator it = m_Objects.begin();
            it != m_Objects.end(); ++it) {
            delete *it;
        }
        m_Objects.clear();

        // Clear all stored mesh instances
        for (std::vector<Mesh*>::iterator it = m_Meshes.begin();
            it != m_Meshes.end(); ++it) {
            delete *it;
        }
        m_Meshes.clear();

        for(GroupMapIt it = m_Groups.begin(); it != m_Groups.end(); ++it) {
            delete it->second;
        }
        m_Groups.clear();

        for ( std::map<std::string, Material*>::iterator it = m_MaterialMap.begin(); it != m_MaterialMap.end(); ++it ) {
            delete it->second;
        }
    }